

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O3

void __thiscall
dlib::bsp_context::send_data
          (bsp_context *this,vector<char,_std::allocator<char>_> *item,unsigned_long target_node_id)

{
  range *prVar1;
  error *this_00;
  unsigned_long local_50;
  string local_48;
  
  local_50 = target_node_id;
  prVar1 = map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
           ::operator[](this->_cons,&local_50);
  if (((prVar1->_M_t).
       super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>._M_t.
       super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>.
       super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl)->terminated != true) {
    prVar1 = map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             ::operator[](this->_cons,&local_50);
    serialize("",(ostream *)
                 ((long)&(((prVar1->_M_t).
                           super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
                           .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl)->
                         stream).super_basic_istream<char,_std::char_traits<char>_> + 0x10));
    prVar1 = map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             ::operator[](this->_cons,&local_50);
    serialize(&this->current_epoch,
              (ostream *)
              ((long)&(((prVar1->_M_t).
                        super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
                        .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl)->stream)
                      .super_basic_istream<char,_std::char_traits<char>_> + 0x10));
    prVar1 = map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             ::operator[](this->_cons,&local_50);
    serialize<std::allocator<char>>
              (item,(ostream *)
                    ((long)&(((prVar1->_M_t).
                              super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
                              .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl)->
                            stream).super_basic_istream<char,_std::char_traits<char>_> + 0x10));
    map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
    ::operator[](this->_cons,&local_50);
    std::ostream::flush();
    notify_control_node(this,'\x02');
    return;
  }
  this_00 = (error *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Attempt to send a message to a node that has terminated.","");
  error::error(this_00,ESOCKET,&local_48);
  *(undefined ***)this_00 = &PTR__error_0030fb70;
  __cxa_throw(this_00,&socket_error::typeinfo,error::~error);
}

Assistant:

void bsp_context::
    send_data(
        const std::vector<char>& item,
        unsigned long target_node_id
    ) 
    {
        using namespace impl2;
        if (_cons[target_node_id]->terminated)
            throw socket_error("Attempt to send a message to a node that has terminated.");

        serialize(MESSAGE_HEADER, _cons[target_node_id]->stream);
        serialize(current_epoch, _cons[target_node_id]->stream);
        serialize(item, _cons[target_node_id]->stream);
        _cons[target_node_id]->stream.flush();

        notify_control_node(SENT_MESSAGE);
    }